

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

int64_t Assimp::strtol10_64(char *in,char **out,uint *max_inout)

{
  char cVar1;
  uint64_t uVar2;
  
  cVar1 = *in;
  uVar2 = strtoul10_64(in + (cVar1 == '+' || cVar1 == '-'),out,max_inout);
  if (cVar1 == '-') {
    uVar2 = -uVar2;
  }
  return uVar2;
}

Assistant:

inline
int64_t strtol10_64(const char* in, const char** out = 0, unsigned int* max_inout = 0) {
    bool inv = (*in == '-');
    if ( inv || *in == '+' ) {
        ++in;
    }

    int64_t value = strtoul10_64(in, out, max_inout);
    if (inv) {
        value = -value;
    }
    return value;
}